

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O1

hugeint_t duckdb::DecimalScaleDownOperator::Operation<short,duckdb::hugeint_t>
                    (short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  undefined6 in_register_0000003a;
  unkbyte10 Var5;
  hugeint_t result;
  hugeint_t local_48;
  string local_38;
  
  lVar1 = (long)((ulong)(uint)((int)CONCAT62(in_register_0000003a,input) >> 0x1f) << 0x20 |
                CONCAT62(in_register_0000003a,input) & 0xffffffff) /
          (long)((int)(short)(*(short *)((long)dataptr + 0x22) -
                             (*(short *)((long)dataptr + 0x22) >> 0xf)) >> 1);
  iVar2 = (int)lVar1;
  uVar4 = iVar2 + 1;
  if ((short)lVar1 < 0) {
    uVar4 = iVar2 + 0xffff;
  }
  uVar4 = (int)(short)uVar4 + ((uVar4 & 0xffff) >> 0xf);
  bVar3 = TryCast::Operation<short,duckdb::hugeint_t>((int16_t)((int)uVar4 >> 1),&local_48,false);
  if (bVar3) {
    return local_48;
  }
  Var5 = __cxa_allocate_exception(0x10);
  CastExceptionText<short,duckdb::hugeint_t>
            (&local_38,(duckdb *)(ulong)(uint)(int)(short)(uVar4 >> 1),
             (short)((unkuint10)Var5 >> 0x40));
  InvalidInputException::InvalidInputException((InvalidInputException *)Var5,(string *)&local_38);
  __cxa_throw((InvalidInputException *)Var5,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		//	We need to round here, not truncate.
		auto data = (DecimalScaleInput<INPUT_TYPE> *)dataptr;
		//	Scale first so we don't overflow when rounding.
		const auto scaling = data->factor / 2;
		input /= scaling;
		if (input < 0) {
			input -= 1;
		} else {
			input += 1;
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input / 2);
	}